

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O1

void av1_cyclic_refresh_update_parameters(AV1_COMP *cpi)

{
  byte bVar1;
  int iVar2;
  aom_tune_content aVar3;
  int iVar4;
  AV1_PRIMARY *pAVar5;
  CYCLIC_REFRESH *pCVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  
  pAVar5 = cpi->ppi;
  pCVar6 = cpi->cyclic_refresh;
  iVar2 = (cpi->rc).best_quality;
  iVar11 = 0x10;
  if (0xb < iVar2) {
    iVar11 = iVar2 + 4;
  }
  iVar2 = (cpi->rc).high_source_sad;
  aVar3 = (cpi->oxcf).tune_cfg.content;
  bVar7 = pAVar5->use_svc != 0;
  iVar9 = (cpi->rc).frames_since_key;
  if ((aVar3 == AOM_CONTENT_SCREEN && !bVar7) && (pCVar6->counter_encode_maxq_scene_change <= iVar9)
     ) {
    iVar9 = pCVar6->counter_encode_maxq_scene_change;
  }
  bVar1 = (cpi->common).current_frame.frame_type;
  if ((iVar2 != 0 || (bVar1 & 0xfd) == 0) || ((pAVar5->rtc_ref).bias_recovery_frame == true)) {
    pCVar6->percent_refresh_adjustment = 5;
    pCVar6->rate_ratio_qdelta_adjustment = 0.25;
  }
  piVar10 = &pCVar6->apply_cyclic_refresh;
  pCVar6->skip_over4x4 = (uint)(9 < (cpi->oxcf).speed);
  pCVar6->apply_cyclic_refresh = 1;
  if ((((((bVar1 & 0xfd) == 0) ||
        (((((cpi->oxcf).rc_cfg.best_allowed_q == 0 && ((cpi->oxcf).rc_cfg.worst_allowed_q == 0)) ||
          (iVar2 != 0 || (cpi->rc).high_motion_content_screen_rtc != 0)) ||
         ((lVar12 = (long)(cpi->svc).temporal_layer_id, 0 < lVar12 ||
          (iVar2 = (cpi->svc).number_spatial_layers, (cpi->svc).prev_number_spatial_layers != iVar2)
          ))))) || (iVar4 = (pAVar5->p_rc).avg_frame_qindex[1], iVar4 < iVar11)) ||
      (((1 < iVar2 && ((cpi->svc).layer_context[lVar12].is_key_frame != 0)) ||
       ((0x14 < iVar9 && 0xeb < iVar4 ||
        (((iVar2 = (cpi->rc).avg_frame_low_motion, iVar2 != 0 && (iVar2 < 0x1e)) && (0x28 < iVar9)))
        ))))) || ((pAVar5->rtc_ref).bias_recovery_frame != false)) goto LAB_003b1ddf;
  iVar2 = (cpi->svc).number_temporal_layers;
  iVar11 = 0xf;
  if (iVar2 < 3) {
    iVar11 = pCVar6->percent_refresh_adjustment + 10;
  }
  pCVar6->percent_refresh = iVar11;
  if (((cpi->active_map).enabled != 0) &&
     (iVar11 = (100 - (cpi->rc).percent_blocks_inactive) * iVar11,
     pCVar6->percent_refresh = iVar11 / 100, iVar11 + 99U < 199)) {
    *piVar10 = 0;
  }
  pCVar6->max_qdelta_perc = 0x3c;
  pCVar6->time_for_refresh = 0;
  if (aVar3 == AOM_CONTENT_SCREEN) {
    uVar8 = 0;
    iVar11 = 10;
  }
  else {
    uVar8 = (uint)(((cpi->common).seq_params)->sb_size == BLOCK_64X64);
    iVar11 = 0xf;
  }
  pCVar6->use_block_sad_scene_det = uVar8;
  pCVar6->motion_thresh = 0x20;
  pCVar6->rate_boost_fac = iVar11;
  if (pCVar6->percent_refresh < 1) {
    dVar13 = pCVar6->rate_ratio_qdelta_adjustment;
LAB_003b1d05:
    dVar13 = dVar13 + 2.25;
LAB_003b1d0d:
    pCVar6->rate_ratio_qdelta = dVar13;
  }
  else {
    if (aVar3 != AOM_CONTENT_SCREEN || bVar7) {
      dVar13 = pCVar6->rate_ratio_qdelta_adjustment;
      if ((int)(100 / (ulong)(uint)pCVar6->percent_refresh) * iVar2 * 4 <= iVar9) goto LAB_003b1d05;
      dVar13 = dVar13 + 3.0;
      goto LAB_003b1d0d;
    }
    dVar14 = (double)(iVar9 / 10) * 0.1;
    dVar13 = 0.75;
    if (dVar14 <= 0.75) {
      dVar13 = dVar14;
    }
    dVar13 = (pCVar6->rate_ratio_qdelta_adjustment + 3.0) - dVar13;
    pCVar6->rate_ratio_qdelta = dVar13;
    if ((iVar9 < 10) && (((cpi->rc).rc_1_frame < 0 || ((cpi->rc).rc_2_frame < 0)))) {
      dVar13 = dVar13 + -0.25;
      goto LAB_003b1d0d;
    }
  }
  if ((cpi->common).height * (cpi->common).width < 0x18c01) {
    if (iVar2 < 2) {
      if (2999 < (cpi->rc).avg_frame_bandwidth) {
        pCVar6->max_qdelta_perc = 0x32;
        dVar13 = pCVar6->rate_ratio_qdelta;
        if (dVar13 <= 2.0) {
          dVar13 = 2.0;
        }
        pCVar6->rate_ratio_qdelta = dVar13;
        goto LAB_003b1d68;
      }
      pCVar6->motion_thresh = 0x10;
    }
    else {
      pCVar6->motion_thresh = 0x20;
    }
    pCVar6->rate_boost_fac = 0xd;
  }
LAB_003b1d68:
  if ((cpi->oxcf).rc_cfg.mode == AOM_VBR) {
    pCVar6->percent_refresh = 10;
    pCVar6->rate_ratio_qdelta = 1.5;
    pCVar6->rate_boost_fac = 10;
    if ((cpi->refresh_frame).golden_frame == true) {
      pCVar6->percent_refresh = 0;
      pCVar6->rate_ratio_qdelta = 1.0;
    }
  }
  if ((cpi->rc).rtc_external_ratectrl == 0) {
    return;
  }
  pCVar6->actual_num_seg1_blocks =
       ((cpi->common).mi_params.mi_rows * pCVar6->percent_refresh * (cpi->common).mi_params.mi_cols)
       / 100;
  piVar10 = &pCVar6->actual_num_seg2_blocks;
LAB_003b1ddf:
  *piVar10 = 0;
  return;
}

Assistant:

void av1_cyclic_refresh_update_parameters(AV1_COMP *const cpi) {
  // TODO(marpan): Parameters need to be tuned.
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1_COMMON *const cm = &cpi->common;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  SVC *const svc = &cpi->svc;
  const int qp_thresh = AOMMAX(16, rc->best_quality + 4);
  const int qp_max_thresh = 118 * MAXQ >> 7;
  const int scene_change_detected = is_scene_change_detected(cpi);
  const int is_screen_content =
      (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN);

  // A scene change or key frame marks the start of a cyclic refresh cycle.
  const int frames_since_scene_change =
      (cpi->ppi->use_svc || !is_screen_content)
          ? cpi->rc.frames_since_key
          : AOMMIN(cpi->rc.frames_since_key,
                   cr->counter_encode_maxq_scene_change);

  // Cases to reset the cyclic refresh adjustment parameters.
  if (frame_is_intra_only(cm) || scene_change_detected ||
      cpi->ppi->rtc_ref.bias_recovery_frame) {
    // Reset adaptive elements for intra only frames and scene changes.
    cr->percent_refresh_adjustment = 5;
    cr->rate_ratio_qdelta_adjustment = 0.25;
  }

  // Although this segment feature for RTC is only used for
  // blocks >= 8X8, for more efficient coding of the seg map
  // cur_frame->seg_map needs to set at 4x4 along with the
  // function av1_cyclic_reset_segment_skip(). Skipping over
  // 4x4 will therefore have small bdrate loss (~0.2%), so
  // we use it only for speed > 9 for now.
  cr->skip_over4x4 = (cpi->oxcf.speed > 9) ? 1 : 0;

  // should we enable cyclic refresh on this frame.
  cr->apply_cyclic_refresh = 1;
  if (frame_is_intra_only(cm) || is_lossless_requested(&cpi->oxcf.rc_cfg) ||
      cpi->rc.high_motion_content_screen_rtc || scene_change_detected ||
      svc->temporal_layer_id > 0 ||
      svc->prev_number_spatial_layers != svc->number_spatial_layers ||
      p_rc->avg_frame_qindex[INTER_FRAME] < qp_thresh ||
      (svc->number_spatial_layers > 1 &&
       svc->layer_context[svc->temporal_layer_id].is_key_frame) ||
      (frames_since_scene_change > 20 &&
       p_rc->avg_frame_qindex[INTER_FRAME] > qp_max_thresh) ||
      (rc->avg_frame_low_motion && rc->avg_frame_low_motion < 30 &&
       frames_since_scene_change > 40) ||
      cpi->ppi->rtc_ref.bias_recovery_frame) {
    cr->apply_cyclic_refresh = 0;
    return;
  }

  // Increase the amount of refresh for #temporal_layers > 2
  if (svc->number_temporal_layers > 2)
    cr->percent_refresh = 15;
  else
    cr->percent_refresh = 10 + cr->percent_refresh_adjustment;

  if (cpi->active_map.enabled) {
    // Scale down the percent_refresh to target the active blocks only.
    cr->percent_refresh =
        cr->percent_refresh * (100 - cpi->rc.percent_blocks_inactive) / 100;
    if (cr->percent_refresh == 0) {
      cr->apply_cyclic_refresh = 0;
    }
  }

  cr->max_qdelta_perc = 60;
  cr->time_for_refresh = 0;
  cr->use_block_sad_scene_det =
      (cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN &&
       cm->seq_params->sb_size == BLOCK_64X64)
          ? 1
          : 0;
  cr->motion_thresh = 32;
  cr->rate_boost_fac =
      (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) ? 10 : 15;

  // Use larger delta-qp (increase rate_ratio_qdelta) for first few
  // refresh cycles after a key frame (svc) or scene change (non svc).
  // For non svc screen content, after a scene change gradually reduce
  // this boost and supress it further if either of the previous two
  // frames overshot.
  if (cr->percent_refresh > 0) {
    if (cpi->ppi->use_svc || !is_screen_content) {
      if (frames_since_scene_change <
          ((4 * svc->number_temporal_layers) * (100 / cr->percent_refresh))) {
        cr->rate_ratio_qdelta = 3.0 + cr->rate_ratio_qdelta_adjustment;
      } else {
        cr->rate_ratio_qdelta = 2.25 + cr->rate_ratio_qdelta_adjustment;
      }
    } else {
      double distance_from_sc_factor =
          AOMMIN(0.75, (int)(frames_since_scene_change / 10) * 0.1);
      cr->rate_ratio_qdelta =
          3.0 + cr->rate_ratio_qdelta_adjustment - distance_from_sc_factor;
      if ((frames_since_scene_change < 10) &&
          ((cpi->rc.rc_1_frame < 0) || (cpi->rc.rc_2_frame < 0))) {
        cr->rate_ratio_qdelta -= 0.25;
      }
    }
  } else {
    cr->rate_ratio_qdelta = 2.25 + cr->rate_ratio_qdelta_adjustment;
  }
  // Adjust some parameters for low resolutions.
  if (cm->width * cm->height <= 352 * 288) {
    if (cpi->svc.number_temporal_layers > 1) {
      cr->motion_thresh = 32;
      cr->rate_boost_fac = 13;
    } else {
      if (rc->avg_frame_bandwidth < 3000) {
        cr->motion_thresh = 16;
        cr->rate_boost_fac = 13;
      } else {
        cr->max_qdelta_perc = 50;
        cr->rate_ratio_qdelta = AOMMAX(cr->rate_ratio_qdelta, 2.0);
      }
    }
  }
  if (cpi->oxcf.rc_cfg.mode == AOM_VBR) {
    // To be adjusted for VBR mode, e.g., based on gf period and boost.
    // For now use smaller qp-delta (than CBR), no second boosted seg, and
    // turn-off (no refresh) on golden refresh (since it's already boosted).
    cr->percent_refresh = 10;
    cr->rate_ratio_qdelta = 1.5;
    cr->rate_boost_fac = 10;
    if (cpi->refresh_frame.golden_frame) {
      cr->percent_refresh = 0;
      cr->rate_ratio_qdelta = 1.0;
    }
  }
  if (rc->rtc_external_ratectrl) {
    cr->actual_num_seg1_blocks = cr->percent_refresh * cm->mi_params.mi_rows *
                                 cm->mi_params.mi_cols / 100;
    cr->actual_num_seg2_blocks = 0;
  }
}